

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O0

HighsStatus __thiscall
Highs::getCols(Highs *this,HighsInt from_col,HighsInt to_col,HighsInt *num_col,double *costs,
              double *lower,double *upper,HighsInt *num_nz,HighsInt *start,HighsInt *index,
              double *value)

{
  HighsInt HVar1;
  Highs *in_RCX;
  uint in_EDX;
  uint in_ESI;
  long in_RDI;
  HighsIndexCollection *in_R8;
  HighsInt *in_R9;
  HighsInt *in_stack_00000010;
  HighsIndexCollection *in_stack_00000018;
  HighsInt *in_stack_00000020;
  double *in_stack_00000028;
  HighsInt create_error;
  HighsIndexCollection index_collection;
  HighsIndexCollection *in_stack_ffffffffffffff30;
  double *in_stack_ffffffffffffffb0;
  double *in_stack_ffffffffffffffb8;
  double *in_stack_ffffffffffffffc0;
  HighsStatus local_c;
  
  if ((int)in_EDX < (int)in_ESI) {
    *(undefined4 *)&in_RCX->_vptr_Highs = 0;
    *in_stack_00000010 = 0;
    local_c = kOk;
  }
  else {
    HighsIndexCollection::HighsIndexCollection(in_stack_ffffffffffffff30);
    HVar1 = create((HighsIndexCollection *)&stack0xffffffffffffff78,in_ESI,in_EDX,
                   *(HighsInt *)(in_RDI + 0x138));
    if (HVar1 == 0) {
      getColsInterface(in_RCX,in_R8,in_R9,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                       in_stack_ffffffffffffffb0,in_stack_00000010,&in_stack_00000018->dimension_,
                       in_stack_00000020,in_stack_00000028);
      local_c = kOk;
      in_stack_ffffffffffffff30 = in_stack_00000018;
    }
    else {
      highsLogUser((HighsLogOptions *)(in_RDI + 0xe28),kError,
                   "Interval [%d, %d] supplied to Highs::getCols is out of range [0, %d)\n",
                   (ulong)in_ESI,(ulong)in_EDX,(ulong)*(uint *)(in_RDI + 0x138));
      local_c = kError;
    }
    HighsIndexCollection::~HighsIndexCollection(in_stack_ffffffffffffff30);
  }
  return local_c;
}

Assistant:

HighsStatus Highs::getCols(const HighsInt from_col, const HighsInt to_col,
                           HighsInt& num_col, double* costs, double* lower,
                           double* upper, HighsInt& num_nz, HighsInt* start,
                           HighsInt* index, double* value) const {
  if (from_col > to_col) {
    // Empty interval
    num_col = 0;
    num_nz = 0;
    return HighsStatus::kOk;
  }
  HighsIndexCollection index_collection;
  const HighsInt create_error =
      create(index_collection, from_col, to_col, model_.lp_.num_col_);
  if (create_error) {
    highsLogUser(options_.log_options, HighsLogType::kError,
                 "Interval [%d, %d] supplied to Highs::getCols is out of range "
                 "[0, %d)\n",
                 int(from_col), int(to_col), int(model_.lp_.num_col_));
    return HighsStatus::kError;
  }
  getColsInterface(index_collection, num_col, costs, lower, upper, num_nz,
                   start, index, value);
  return HighsStatus::kOk;
}